

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O2

void __thiscall DPolyobjInterpolation::Serialize(DPolyobjInterpolation *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DInterpolation::Serialize(&this->super_DInterpolation,arc);
  pFVar1 = FSerializer::operator()(arc,"poly",&this->poly);
  pFVar1 = FSerializer::operator()(pFVar1,"oldverts",&this->oldverts);
  pFVar1 = FSerializer::operator()(pFVar1,"oldcx",&this->oldcx);
  FSerializer::operator()(pFVar1,"oldcy",&this->oldcy);
  if (arc->r != (FReader *)0x0) {
    TArray<double,_double>::Resize(&this->bakverts,(this->oldverts).Count);
    return;
  }
  return;
}

Assistant:

void DPolyobjInterpolation::Serialize(FSerializer &arc)
{
	Super::Serialize(arc);
	arc("poly", poly)
		("oldverts", oldverts)
		("oldcx", oldcx)
		("oldcy", oldcy);
	if (arc.isReading()) bakverts.Resize(oldverts.Size());
}